

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void PredictorAdd10_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar12 [16];
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined4 uVar50;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  char cVar39;
  undefined8 uVar40;
  char cVar44;
  char cVar45;
  char cVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar51;
  undefined1 auVar43 [16];
  
  auVar6 = _DAT_001b8650;
  uVar10 = 0;
  if (3 < num_pixels) {
    auVar37 = ZEXT416(out[-1]);
    uVar9 = 0;
    do {
      puVar1 = in + uVar9;
      cVar39 = (char)puVar1[2];
      cVar44 = *(char *)((long)puVar1 + 9);
      cVar45 = *(char *)((long)puVar1 + 10);
      cVar46 = *(char *)((long)puVar1 + 0xb);
      cVar2 = (char)puVar1[3];
      cVar3 = *(char *)((long)puVar1 + 0xd);
      cVar4 = *(char *)((long)puVar1 + 0xe);
      cVar5 = *(char *)((long)puVar1 + 0xf);
      auVar47 = *(undefined1 (*) [16])(upper + (uVar9 - 1));
      auVar12 = *(undefined1 (*) [16])(upper + uVar9);
      auVar41 = *(undefined1 (*) [16])(upper + uVar9 + 1);
      cVar11 = pavgb(auVar12[0],auVar41[0]);
      cVar13 = pavgb(auVar12[1],auVar41[1]);
      cVar14 = pavgb(auVar12[2],auVar41[2]);
      cVar15 = pavgb(auVar12[3],auVar41[3]);
      cVar16 = pavgb(auVar12[4],auVar41[4]);
      cVar17 = pavgb(auVar12[5],auVar41[5]);
      cVar18 = pavgb(auVar12[6],auVar41[6]);
      cVar19 = pavgb(auVar12[7],auVar41[7]);
      cVar20 = pavgb(auVar12[8],auVar41[8]);
      cVar21 = pavgb(auVar12[9],auVar41[9]);
      cVar22 = pavgb(auVar12[10],auVar41[10]);
      cVar23 = pavgb(auVar12[0xb],auVar41[0xb]);
      cVar24 = pavgb(auVar12[0xc],auVar41[0xc]);
      cVar25 = pavgb(auVar12[0xd],auVar41[0xd]);
      cVar26 = pavgb(auVar12[0xe],auVar41[0xe]);
      cVar27 = pavgb(auVar12[0xf],auVar41[0xf]);
      auVar41 = (auVar41 ^ auVar12) & auVar6;
      auVar12[0] = cVar11 - auVar41[0];
      auVar12[1] = cVar13 - auVar41[1];
      auVar12[2] = cVar14 - auVar41[2];
      auVar12[3] = cVar15 - auVar41[3];
      auVar12[4] = cVar16 - auVar41[4];
      auVar12[5] = cVar17 - auVar41[5];
      auVar12[6] = cVar18 - auVar41[6];
      auVar12[7] = cVar19 - auVar41[7];
      auVar12[8] = cVar20 - auVar41[8];
      auVar12[9] = cVar21 - auVar41[9];
      auVar12[10] = cVar22 - auVar41[10];
      auVar12[0xb] = cVar23 - auVar41[0xb];
      auVar12[0xc] = cVar24 - auVar41[0xc];
      auVar12[0xd] = cVar25 - auVar41[0xd];
      auVar12[0xe] = cVar26 - auVar41[0xe];
      auVar12[0xf] = cVar27 - auVar41[0xf];
      cVar11 = pavgb(auVar37[0],auVar47[0]);
      cVar13 = pavgb(auVar37[1],auVar47[1]);
      cVar14 = pavgb(auVar37[2],auVar47[2]);
      cVar15 = pavgb(auVar37[3],auVar47[3]);
      cVar16 = pavgb(auVar37[4],auVar47[4]);
      cVar17 = pavgb(auVar37[5],auVar47[5]);
      cVar18 = pavgb(auVar37[6],auVar47[6]);
      cVar19 = pavgb(auVar37[7],auVar47[7]);
      uVar28 = auVar47[8];
      cVar20 = pavgb(auVar37[8],uVar28);
      uVar29 = auVar47[9];
      cVar21 = pavgb(auVar37[9],uVar29);
      uVar30 = auVar47[10];
      cVar22 = pavgb(auVar37[10],uVar30);
      uVar31 = auVar47[0xb];
      cVar23 = pavgb(auVar37[0xb],uVar31);
      uVar32 = auVar47[0xc];
      cVar24 = pavgb(auVar37[0xc],uVar32);
      uVar33 = auVar47[0xd];
      cVar25 = pavgb(auVar37[0xd],uVar33);
      uVar34 = auVar47[0xe];
      cVar26 = pavgb(auVar37[0xe],uVar34);
      uVar35 = auVar47[0xf];
      cVar27 = pavgb(auVar37[0xf],uVar35);
      auVar37 = (auVar47 ^ auVar37) & auVar6;
      auVar38[0] = cVar11 - auVar37[0];
      auVar38[1] = cVar13 - auVar37[1];
      auVar38[2] = cVar14 - auVar37[2];
      auVar38[3] = cVar15 - auVar37[3];
      auVar38[4] = cVar16 - auVar37[4];
      auVar38[5] = cVar17 - auVar37[5];
      auVar38[6] = cVar18 - auVar37[6];
      auVar38[7] = cVar19 - auVar37[7];
      auVar38[8] = cVar20 - auVar37[8];
      auVar38[9] = cVar21 - auVar37[9];
      auVar38[10] = cVar22 - auVar37[10];
      auVar38[0xb] = cVar23 - auVar37[0xb];
      auVar38[0xc] = cVar24 - auVar37[0xc];
      auVar38[0xd] = cVar25 - auVar37[0xd];
      auVar38[0xe] = cVar26 - auVar37[0xe];
      auVar38[0xf] = cVar27 - auVar37[0xf];
      cVar11 = pavgb(auVar12[0],auVar38[0]);
      cVar13 = pavgb(auVar12[1],auVar38[1]);
      cVar14 = pavgb(auVar12[2],auVar38[2]);
      cVar15 = pavgb(auVar12[3],auVar38[3]);
      cVar16 = pavgb(auVar12[4],auVar38[4]);
      cVar17 = pavgb(auVar12[5],auVar38[5]);
      cVar18 = pavgb(auVar12[6],auVar38[6]);
      cVar19 = pavgb(auVar12[7],auVar38[7]);
      cVar20 = pavgb(auVar12[8],auVar38[8]);
      cVar21 = pavgb(auVar12[9],auVar38[9]);
      cVar22 = pavgb(auVar12[10],auVar38[10]);
      cVar23 = pavgb(auVar12[0xb],auVar38[0xb]);
      cVar24 = pavgb(auVar12[0xc],auVar38[0xc]);
      cVar25 = pavgb(auVar12[0xd],auVar38[0xd]);
      cVar26 = pavgb(auVar12[0xe],auVar38[0xe]);
      cVar27 = pavgb(auVar12[0xf],auVar38[0xf]);
      auVar37 = (auVar38 ^ auVar12) & auVar6;
      cVar11 = (cVar11 - auVar37[0]) + (char)*puVar1;
      cVar13 = (cVar13 - auVar37[1]) + *(char *)((long)puVar1 + 1);
      cVar14 = (cVar14 - auVar37[2]) + *(char *)((long)puVar1 + 2);
      cVar15 = (cVar15 - auVar37[3]) + *(char *)((long)puVar1 + 3);
      uVar50 = CONCAT13(cVar15,CONCAT12(cVar14,CONCAT11(cVar13,cVar11)));
      auVar41[4] = (cVar16 - auVar37[4]) + (char)puVar1[1];
      auVar41[5] = (cVar17 - auVar37[5]) + *(char *)((long)puVar1 + 5);
      auVar41[6] = (cVar18 - auVar37[6]) + *(char *)((long)puVar1 + 6);
      auVar41[7] = (cVar19 - auVar37[7]) + *(char *)((long)puVar1 + 7);
      auVar41[8] = (cVar20 - auVar37[8]) + cVar39;
      auVar41[9] = (cVar21 - auVar37[9]) + cVar44;
      auVar41[10] = (cVar22 - auVar37[10]) + cVar45;
      auVar41[0xb] = (cVar23 - auVar37[0xb]) + cVar46;
      auVar41[0xc] = (cVar24 - auVar37[0xc]) + cVar2;
      auVar41[0xd] = (cVar25 - auVar37[0xd]) + cVar3;
      auVar41[0xe] = (cVar26 - auVar37[0xe]) + cVar4;
      auVar41[0xf] = (cVar27 - auVar37[0xf]) + cVar5;
      cVar11 = pavgb(cVar11,auVar47[4]);
      cVar13 = pavgb(cVar13,auVar47[5]);
      cVar14 = pavgb(cVar14,auVar47[6]);
      cVar15 = pavgb(cVar15,auVar47[7]);
      cVar16 = pavgb(auVar41[4],uVar28);
      cVar17 = pavgb(auVar41[5],uVar29);
      cVar18 = pavgb(auVar41[6],uVar30);
      cVar19 = pavgb(auVar41[7],uVar31);
      cVar20 = pavgb(auVar41[8],uVar32);
      cVar21 = pavgb(auVar41[9],uVar33);
      cVar22 = pavgb(auVar41[10],uVar34);
      cVar23 = pavgb(auVar41[0xb],uVar35);
      cVar24 = pavgb(auVar41[0xc],0);
      cVar25 = pavgb(auVar41[0xd],0);
      cVar26 = pavgb(auVar41[0xe],0);
      cVar27 = pavgb(auVar41[0xf],0);
      auVar37 = (auVar47 >> 0x20 ^ auVar41) & auVar6;
      auVar48[0] = cVar11 - auVar37[0];
      auVar48[1] = cVar13 - auVar37[1];
      auVar48[2] = cVar14 - auVar37[2];
      auVar48[3] = cVar15 - auVar37[3];
      auVar48[4] = cVar16 - auVar37[4];
      auVar48[5] = cVar17 - auVar37[5];
      auVar48[6] = cVar18 - auVar37[6];
      auVar48[7] = cVar19 - auVar37[7];
      auVar48[8] = cVar20 - auVar37[8];
      auVar48[9] = cVar21 - auVar37[9];
      auVar48[10] = cVar22 - auVar37[10];
      auVar48[0xb] = cVar23 - auVar37[0xb];
      auVar48[0xc] = cVar24 - auVar37[0xc];
      auVar48[0xd] = cVar25 - auVar37[0xd];
      auVar48[0xe] = cVar26 - auVar37[0xe];
      auVar48[0xf] = cVar27 - auVar37[0xf];
      cVar11 = pavgb(auVar12[4],auVar48[0]);
      cVar13 = pavgb(auVar12[5],auVar48[1]);
      cVar14 = pavgb(auVar12[6],auVar48[2]);
      cVar15 = pavgb(auVar12[7],auVar48[3]);
      cVar16 = pavgb(auVar12[8],auVar48[4]);
      cVar17 = pavgb(auVar12[9],auVar48[5]);
      cVar18 = pavgb(auVar12[10],auVar48[6]);
      cVar19 = pavgb(auVar12[0xb],auVar48[7]);
      cVar20 = pavgb(auVar12[0xc],auVar48[8]);
      cVar21 = pavgb(auVar12[0xd],auVar48[9]);
      cVar22 = pavgb(auVar12[0xe],auVar48[10]);
      cVar23 = pavgb(auVar12[0xf],auVar48[0xb]);
      cVar24 = pavgb(0,auVar48[0xc]);
      cVar25 = pavgb(0,auVar48[0xd]);
      cVar26 = pavgb(0,auVar48[0xe]);
      cVar27 = pavgb(0,auVar48[0xf]);
      auVar37 = (auVar48 ^ auVar12 >> 0x20) & auVar6;
      auVar42[0xc] = cVar24 - auVar37[0xc];
      auVar42[0xd] = cVar25 - auVar37[0xd];
      auVar42[0xe] = cVar26 - auVar37[0xe];
      auVar42[0xf] = cVar27 - auVar37[0xf];
      cVar11 = (cVar11 - auVar37[0]) + (char)puVar1[1];
      cVar13 = (cVar13 - auVar37[1]) + *(char *)((long)puVar1 + 5);
      cVar14 = (cVar14 - auVar37[2]) + *(char *)((long)puVar1 + 6);
      cVar15 = (cVar15 - auVar37[3]) + *(char *)((long)puVar1 + 7);
      auVar42._0_4_ = CONCAT13(cVar15,CONCAT12(cVar14,CONCAT11(cVar13,cVar11)));
      auVar42[4] = (cVar16 - auVar37[4]) + cVar39;
      auVar42[5] = (cVar17 - auVar37[5]) + cVar44;
      auVar42[6] = (cVar18 - auVar37[6]) + cVar45;
      auVar42[7] = (cVar19 - auVar37[7]) + cVar46;
      auVar42[8] = (cVar20 - auVar37[8]) + cVar2;
      auVar42[9] = (cVar21 - auVar37[9]) + cVar3;
      auVar42[10] = (cVar22 - auVar37[10]) + cVar4;
      auVar42[0xb] = (cVar23 - auVar37[0xb]) + cVar5;
      uVar36 = CONCAT44(auVar42._0_4_,uVar50);
      cVar11 = pavgb(cVar11,uVar28);
      cVar13 = pavgb(cVar13,uVar29);
      cVar14 = pavgb(cVar14,uVar30);
      cVar15 = pavgb(cVar15,uVar31);
      cVar16 = pavgb(auVar42[4],uVar32);
      cVar17 = pavgb(auVar42[5],uVar33);
      cVar18 = pavgb(auVar42[6],uVar34);
      cVar19 = pavgb(auVar42[7],uVar35);
      cVar20 = pavgb(auVar42[8],0);
      cVar21 = pavgb(auVar42[9],0);
      cVar22 = pavgb(auVar42[10],0);
      cVar23 = pavgb(auVar42[0xb],0);
      cVar24 = pavgb(auVar42[0xc],0);
      cVar25 = pavgb(auVar42[0xd],0);
      cVar26 = pavgb(auVar42[0xe],0);
      cVar27 = pavgb(auVar42[0xf],0);
      auVar37 = (auVar47 >> 0x40 ^ auVar42) & auVar6;
      auVar49[0] = cVar11 - auVar37[0];
      auVar49[1] = cVar13 - auVar37[1];
      auVar49[2] = cVar14 - auVar37[2];
      auVar49[3] = cVar15 - auVar37[3];
      auVar49[4] = cVar16 - auVar37[4];
      auVar49[5] = cVar17 - auVar37[5];
      auVar49[6] = cVar18 - auVar37[6];
      auVar49[7] = cVar19 - auVar37[7];
      auVar49[8] = cVar20 - auVar37[8];
      auVar49[9] = cVar21 - auVar37[9];
      auVar49[10] = cVar22 - auVar37[10];
      auVar49[0xb] = cVar23 - auVar37[0xb];
      auVar49[0xc] = cVar24 - auVar37[0xc];
      auVar49[0xd] = cVar25 - auVar37[0xd];
      auVar49[0xe] = cVar26 - auVar37[0xe];
      auVar49[0xf] = cVar27 - auVar37[0xf];
      cVar11 = pavgb(auVar12[8],auVar49[0]);
      cVar13 = pavgb(auVar12[9],auVar49[1]);
      cVar14 = pavgb(auVar12[10],auVar49[2]);
      cVar15 = pavgb(auVar12[0xb],auVar49[3]);
      cVar16 = pavgb(auVar12[0xc],auVar49[4]);
      cVar17 = pavgb(auVar12[0xd],auVar49[5]);
      cVar18 = pavgb(auVar12[0xe],auVar49[6]);
      cVar19 = pavgb(auVar12[0xf],auVar49[7]);
      cVar20 = pavgb(0,auVar49[8]);
      cVar21 = pavgb(0,auVar49[9]);
      cVar22 = pavgb(0,auVar49[10]);
      cVar23 = pavgb(0,auVar49[0xb]);
      cVar24 = pavgb(0,auVar49[0xc]);
      cVar25 = pavgb(0,auVar49[0xd]);
      cVar26 = pavgb(0,auVar49[0xe]);
      cVar27 = pavgb(0,auVar49[0xf]);
      auVar37 = (auVar49 ^ auVar12 >> 0x40) & auVar6;
      auVar43[8] = cVar20 - auVar37[8];
      auVar43[9] = cVar21 - auVar37[9];
      auVar43[10] = cVar22 - auVar37[10];
      auVar43[0xb] = cVar23 - auVar37[0xb];
      auVar43[0xc] = cVar24 - auVar37[0xc];
      auVar43[0xd] = cVar25 - auVar37[0xd];
      auVar43[0xe] = cVar26 - auVar37[0xe];
      auVar43[0xf] = cVar27 - auVar37[0xf];
      cVar39 = (cVar11 - auVar37[0]) + cVar39;
      cVar44 = (cVar13 - auVar37[1]) + cVar44;
      cVar45 = (cVar14 - auVar37[2]) + cVar45;
      cVar46 = (cVar15 - auVar37[3]) + cVar46;
      uVar51 = CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar39)));
      auVar43[4] = (cVar16 - auVar37[4]) + cVar2;
      auVar43[5] = (cVar17 - auVar37[5]) + cVar3;
      auVar43[6] = (cVar18 - auVar37[6]) + cVar4;
      auVar43[7] = (cVar19 - auVar37[7]) + cVar5;
      cVar39 = pavgb(cVar39,uVar32);
      cVar44 = pavgb(cVar44,uVar33);
      cVar45 = pavgb(cVar45,uVar34);
      cVar46 = pavgb(cVar46,uVar35);
      cVar11 = pavgb(auVar43[4],0);
      cVar13 = pavgb(auVar43[5],0);
      cVar14 = pavgb(auVar43[6],0);
      cVar15 = pavgb(auVar43[7],0);
      cVar16 = pavgb(auVar43[8],0);
      cVar17 = pavgb(auVar43[9],0);
      cVar18 = pavgb(auVar43[10],0);
      cVar19 = pavgb(auVar43[0xb],0);
      cVar20 = pavgb(auVar43[0xc],0);
      cVar21 = pavgb(auVar43[0xd],0);
      cVar22 = pavgb(auVar43[0xe],0);
      cVar23 = pavgb(auVar43[0xf],0);
      auVar37 = (auVar47 >> 0x60 ^ auVar43) & auVar6;
      auVar47[0] = cVar39 - auVar37[0];
      auVar47[1] = cVar44 - auVar37[1];
      auVar47[2] = cVar45 - auVar37[2];
      auVar47[3] = cVar46 - auVar37[3];
      auVar47[4] = cVar11 - auVar37[4];
      auVar47[5] = cVar13 - auVar37[5];
      auVar47[6] = cVar14 - auVar37[6];
      auVar47[7] = cVar15 - auVar37[7];
      auVar47[8] = cVar16 - auVar37[8];
      auVar47[9] = cVar17 - auVar37[9];
      auVar47[10] = cVar18 - auVar37[10];
      auVar47[0xb] = cVar19 - auVar37[0xb];
      auVar47[0xc] = cVar20 - auVar37[0xc];
      auVar47[0xd] = cVar21 - auVar37[0xd];
      auVar47[0xe] = cVar22 - auVar37[0xe];
      auVar47[0xf] = cVar23 - auVar37[0xf];
      cVar39 = pavgb(auVar12[0xc],auVar47[0]);
      cVar44 = pavgb(auVar12[0xd],auVar47[1]);
      cVar45 = pavgb(auVar12[0xe],auVar47[2]);
      cVar46 = pavgb(auVar12[0xf],auVar47[3]);
      cVar11 = pavgb(0,auVar47[4]);
      cVar13 = pavgb(0,auVar47[5]);
      cVar14 = pavgb(0,auVar47[6]);
      cVar15 = pavgb(0,auVar47[7]);
      cVar16 = pavgb(0,auVar47[8]);
      cVar17 = pavgb(0,auVar47[9]);
      cVar18 = pavgb(0,auVar47[10]);
      cVar19 = pavgb(0,auVar47[0xb]);
      cVar20 = pavgb(0,auVar47[0xc]);
      cVar21 = pavgb(0,auVar47[0xd]);
      cVar22 = pavgb(0,auVar47[0xe]);
      cVar23 = pavgb(0,auVar47[0xf]);
      auVar47 = (auVar47 ^ auVar12 >> 0x60) & auVar6;
      auVar37[4] = cVar11 - auVar47[4];
      auVar37[5] = cVar13 - auVar47[5];
      auVar37[6] = cVar14 - auVar47[6];
      auVar37[7] = cVar15 - auVar47[7];
      auVar37[8] = cVar16 - auVar47[8];
      auVar37[9] = cVar17 - auVar47[9];
      auVar37[10] = cVar18 - auVar47[10];
      auVar37[0xb] = cVar19 - auVar47[0xb];
      auVar37[0xc] = cVar20 - auVar47[0xc];
      auVar37[0xd] = cVar21 - auVar47[0xd];
      auVar37[0xe] = cVar22 - auVar47[0xe];
      auVar37[0xf] = cVar23 - auVar47[0xf];
      auVar37._0_4_ =
           CONCAT13((cVar46 - auVar47[3]) + cVar5,
                    CONCAT12((cVar45 - auVar47[2]) + cVar4,
                             CONCAT11((cVar44 - auVar47[1]) + cVar3,(cVar39 - auVar47[0]) + cVar2)))
      ;
      uVar40 = CONCAT44(auVar37._0_4_,uVar51);
      *(undefined8 *)(out + uVar9) = uVar36;
      *(undefined8 *)(out + uVar9 + 2) = uVar40;
      uVar10 = uVar9 + 4;
      uVar8 = uVar9 + 8;
      uVar9 = uVar10;
    } while (uVar8 <= (uint)num_pixels);
  }
  iVar7 = num_pixels - (int)uVar10;
  if (iVar7 == 0) {
    return;
  }
  uVar10 = uVar10 & 0xffffffff;
  (*VP8LPredictorsAdd_C[10])(in + uVar10,upper + uVar10,iVar7,out + uVar10);
  return;
}

Assistant:

static void PredictorAdd10_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i L = _mm_cvtsi32_si128((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    __m128i avgTTR;
    Average2_m128i(&T, &TR, &avgTTR);
    DO_PRED10(0);
    DO_PRED10_SHIFT;
    DO_PRED10(1);
    DO_PRED10_SHIFT;
    DO_PRED10(2);
    DO_PRED10_SHIFT;
    DO_PRED10(3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[10](in + i, upper + i, num_pixels - i, out + i);
  }
}